

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.c
# Opt level: O3

ZyanStatus ZyanVectorReallocate(ZyanVector *vector,ZyanUSize capacity)

{
  ulong uVar1;
  ZyanAllocator_ *pZVar2;
  ZyanAllocatorAllocate p_Var3;
  ZyanStatus ZVar4;
  ZyanStatus ZVar5;
  
  uVar1 = vector->capacity;
  if (uVar1 == 0) {
    __assert_fail("vector->capacity >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zycore/src/Vector.c"
                  ,0x57,"ZyanStatus ZyanVectorReallocate(ZyanVector *, ZyanUSize)");
  }
  if (vector->element_size == 0) {
    __assert_fail("vector->element_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zycore/src/Vector.c"
                  ,0x58,"ZyanStatus ZyanVectorReallocate(ZyanVector *, ZyanUSize)");
  }
  if (vector->data == (void *)0x0) {
    __assert_fail("vector->data",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zycore/src/Vector.c"
                  ,0x59,"ZyanStatus ZyanVectorReallocate(ZyanVector *, ZyanUSize)");
  }
  pZVar2 = vector->allocator;
  if (pZVar2 == (ZyanAllocator_ *)0x0) {
    ZVar5 = 0x100000;
    if (uVar1 < capacity) {
      ZVar5 = 0x80100009;
    }
  }
  else {
    p_Var3 = pZVar2->reallocate;
    if (p_Var3 == (ZyanAllocatorAllocate)0x0) {
      __assert_fail("vector->allocator->reallocate",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zycore/src/Vector.c"
                    ,0x65,"ZyanStatus ZyanVectorReallocate(ZyanVector *, ZyanUSize)");
    }
    if ((capacity == 0) && (capacity = 1, uVar1 == 1)) {
      return 0x100000;
    }
    vector->capacity = capacity;
    ZVar4 = (*p_Var3)(pZVar2,&vector->data,vector->element_size,capacity);
    ZVar5 = 0x100000;
    if ((int)ZVar4 < 0) {
      ZVar5 = ZVar4;
    }
  }
  return ZVar5;
}

Assistant:

static ZyanStatus ZyanVectorReallocate(ZyanVector* vector, ZyanUSize capacity)
{
    ZYAN_ASSERT(vector);
    ZYAN_ASSERT(vector->capacity >= ZYAN_VECTOR_MIN_CAPACITY);
    ZYAN_ASSERT(vector->element_size);
    ZYAN_ASSERT(vector->data);

    if (!vector->allocator)
    {
        if (vector->capacity < capacity)
        {
            return ZYAN_STATUS_INSUFFICIENT_BUFFER_SIZE;
        }
        return ZYAN_STATUS_SUCCESS;
    }

    ZYAN_ASSERT(vector->allocator);
    ZYAN_ASSERT(vector->allocator->reallocate);

    if (capacity < ZYAN_VECTOR_MIN_CAPACITY)
    {
        if (vector->capacity > ZYAN_VECTOR_MIN_CAPACITY)
        {
            capacity = ZYAN_VECTOR_MIN_CAPACITY;
        } else
        {
            return ZYAN_STATUS_SUCCESS;
        }
    }

    vector->capacity = capacity;
    ZYAN_CHECK(vector->allocator->reallocate(vector->allocator, &vector->data,
        vector->element_size, vector->capacity));

    return ZYAN_STATUS_SUCCESS;
}